

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketnonblocking.cpp
# Opt level: O2

int __thiscall
hbm::SocketNonblocking::connect(SocketNonblocking *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  undefined4 in_register_00000034;
  addrinfo *pResult;
  socklen_t len;
  int value;
  pollfd pfd;
  addrinfo local_68;
  
  iVar1 = init(this,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,__fd));
  if (iVar1 < 0) {
    iVar3 = -1;
  }
  else {
    pResult = (addrinfo *)0x0;
    local_68.ai_flags = 0;
    local_68.ai_family = 0;
    local_68.ai_addrlen = 0;
    local_68._20_4_ = 0;
    local_68.ai_addr = (sockaddr *)0x0;
    local_68.ai_canonname = (char *)0x0;
    local_68.ai_next = (addrinfo *)0x0;
    local_68.ai_socktype = 1;
    local_68.ai_protocol = 0;
    iVar2 = getaddrinfo(*(char **)CONCAT44(in_register_00000034,__fd),*(char **)__addr,&local_68,
                        (addrinfo **)&pResult);
    iVar3 = -1;
    if (iVar2 == 0) {
      iVar2 = ::connect(this->m_fd,(sockaddr *)pResult->ai_addr,0x10);
      freeaddrinfo((addrinfo *)pResult);
      iVar3 = 0;
      if ((iVar2 == -1) && (piVar4 = __errno_location(), iVar3 = -1, *piVar4 == 0x73)) {
        pfd.fd = this->m_fd;
        pfd.events = 4;
        do {
          iVar3 = poll((pollfd *)&pfd,1,5000);
          if (iVar3 != -1) {
            if (iVar3 != 1) {
              return -1;
            }
            len = 4;
            iVar3 = getsockopt(this->m_fd,1,4,&value,&len);
            if (iVar3 != 0 || value != 0) {
              return -1;
            }
            return iVar1;
          }
          iVar3 = -1;
        } while (*piVar4 == 4);
      }
    }
  }
  return iVar3;
}

Assistant:

int hbm::SocketNonblocking::connect(const std::string &address, const std::string& port)
{
	int retVal = init();
	if(retVal<0) {
		return retVal;
	}


	struct addrinfo hints;
	struct addrinfo* pResult = NULL;

	memset(&hints, 0, sizeof(hints));

	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;


	if( getaddrinfo(address.c_str(), port.c_str(), &hints, &pResult)!=0 ) {
		return -1;
	}
	int err = ::connect(m_fd, pResult->ai_addr, sizeof(sockaddr_in));
	freeaddrinfo( pResult );
	if(err==-1) {
		if(errno == EINPROGRESS) {
			// success if errno equals EINPROGRESS
			struct pollfd pfd;
			pfd.fd = m_fd;
			pfd.events = POLLOUT;
			do {
				err = poll(&pfd, 1, TIMEOUT_CONNECT_S*1000);
			} while((err==-1) && (errno==EINTR) );
			if(err==1) {
				int value;
				socklen_t len = sizeof(value);
				if (getsockopt(m_fd, SOL_SOCKET, SO_ERROR, &value, &len) != 0) {
					retVal = -1;
				} else if(value!=0) {
					retVal = -1;
				}
			} else {
				retVal = -1;
			}
		} else {
			retVal = -1;
		}
	}
	return retVal;
}